

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512-sw.c
# Opt level: O0

void sha512_sw_digest(ssh_hash *hash,uint8_t *digest)

{
  ulong local_28;
  size_t i;
  sha512_sw *s;
  uint8_t *digest_local;
  ssh_hash *hash_local;
  
  sha512_block_pad((sha512_block *)(hash + -0xb),(BinarySink *)&hash[-2].binarysink_);
  for (local_28 = 0; local_28 < hash->vt->hlen >> 3; local_28 = local_28 + 1) {
    PUT_64BIT_MSB_FIRST(digest + local_28 * 8,(uint64_t)(&hash[-0xf].vt)[local_28]);
  }
  return;
}

Assistant:

static void sha512_sw_digest(ssh_hash *hash, uint8_t *digest)
{
    sha512_sw *s = container_of(hash, sha512_sw, hash);

    sha512_block_pad(&s->blk, BinarySink_UPCAST(s));
    for (size_t i = 0; i < hash->vt->hlen / 8; i++)
        PUT_64BIT_MSB_FIRST(digest + 8*i, s->core[i]);
}